

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O0

int If_CutPerformCheck75(If_Man_t *p,uint *pTruth0,int nVars,int nLeaves,char *pStr)

{
  int iVar1;
  uint uVar2;
  char local_448 [4];
  int nSizeNonDec;
  char pDsdStr [1000];
  word local_58;
  word pTruth [4];
  word *pTruthW;
  char *pStr_local;
  int nLeaves_local;
  int nVars_local;
  uint *pTruth0_local;
  If_Man_t *p_local;
  
  local_58 = *(word *)pTruth0;
  pTruth[0] = *(word *)(pTruth0 + 2);
  pTruth[1] = *(word *)(pTruth0 + 4);
  pTruth[2] = *(word *)(pTruth0 + 6);
  pTruth[3] = (word)pTruth0;
  pStr_local._0_4_ = nLeaves;
  pStr_local._4_4_ = nVars;
  _nLeaves_local = pTruth0;
  pTruth0_local = (uint *)p;
  if (8 < nLeaves) {
    __assert_fail("nLeaves <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                  ,0x133,"int If_CutPerformCheck75(If_Man_t *, unsigned int *, int, int, char *)");
  }
  if (p->pPars->fCutMin == 0) {
    Abc_TtMinimumBase(&local_58,(int *)0x0,nLeaves,(int *)&pStr_local);
  }
  if ((int)pStr_local < 6) {
    p_local._4_4_ = 1;
  }
  else {
    if (((int)pStr_local < 8) &&
       (iVar1 = If_CutPerformCheck16
                          ((If_Man_t *)pTruth0_local,(uint *)&local_58,pStr_local._4_4_,
                           (int)pStr_local,"44"), iVar1 != 0)) {
      return 1;
    }
    if (((*(int *)(*(long *)(pTruth0_local + 2) + 0xa0) == 0) &&
        (*(int *)(*(long *)(pTruth0_local + 2) + 0x84) != 0)) && ((int)pStr_local == 8)) {
      iVar1 = Dau_DsdDecompose(&local_58,8,0,0,local_448);
      if (iVar1 < 5) {
        uVar2 = Dau_DsdCheckDecAndExist(local_448);
        if ((uVar2 & 0x10) == 0) {
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = 1;
        }
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      iVar1 = If_CutPerformCheck45
                        ((If_Man_t *)pTruth0_local,(uint *)&local_58,pStr_local._4_4_,
                         (int)pStr_local,pStr);
      if (iVar1 == 0) {
        iVar1 = If_CutPerformCheck54
                          ((If_Man_t *)pTruth0_local,(uint *)&local_58,pStr_local._4_4_,
                           (int)pStr_local,pStr);
        if (iVar1 == 0) {
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = 1;
        }
      }
      else {
        p_local._4_4_ = 1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_CutPerformCheck75( If_Man_t * p, unsigned * pTruth0, int nVars, int nLeaves, char * pStr )
{
    word * pTruthW = (word *)pTruth0;
    word pTruth[4] = { pTruthW[0], pTruthW[1], pTruthW[2], pTruthW[3] };
    assert( nLeaves <= 8 );
    if ( !p->pPars->fCutMin )
        Abc_TtMinimumBase( pTruth, NULL, nLeaves, &nLeaves );
    if ( nLeaves < 6 )
        return 1;
//    if ( nLeaves < 8 && If_CutPerformCheck07( p, (unsigned *)pTruth, nVars, nLeaves, "44" ) )
    if ( nLeaves < 8 && If_CutPerformCheck16( p, (unsigned *)pTruth, nVars, nLeaves, "44" ) )
        return 1;
    // this is faster but not compatible with -z
    if ( !p->pPars->fDeriveLuts && p->pPars->fEnableCheck75 && nLeaves == 8 )
    {
//        char pDsdStr[1000] = "(!(abd)!(c!([fe][gh])))";
        char pDsdStr[1000];
        int nSizeNonDec = Dau_DsdDecompose( (word *)pTruth, nLeaves, 0, 0, pDsdStr );
        if ( nSizeNonDec >= 5 )
            return 0;
        if ( Dau_DsdCheckDecAndExist(pDsdStr) & 0x10 ) // bit 4
            return 1;
        return 0;
    }
    if ( If_CutPerformCheck45( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
        return 1;
    if ( If_CutPerformCheck54( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
        return 1;
    return 0;
}